

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O0

LogStream * __thiscall muduo::LogStream::operator<<(LogStream *this,void *p)

{
  int iVar1;
  char *buf_00;
  size_t sVar2;
  FixedBuffer<4000> *in_RDI;
  size_t len;
  char *buf;
  uintptr_t v;
  uintptr_t in_stack_ffffffffffffffd8;
  
  iVar1 = detail::FixedBuffer<4000>::avail(in_RDI);
  if (0x1f < iVar1) {
    buf_00 = detail::FixedBuffer<4000>::current((Buffer *)in_RDI->data_);
    *buf_00 = '0';
    buf_00[1] = 'x';
    sVar2 = detail::convertHex(buf_00,in_stack_ffffffffffffffd8);
    detail::FixedBuffer<4000>::add((Buffer *)in_RDI->data_,sVar2 + 2);
  }
  return (LogStream *)in_RDI;
}

Assistant:

LogStream& LogStream::operator<<(const void* p)
{
  uintptr_t v = reinterpret_cast<uintptr_t>(p);
  if (buffer_.avail() >= kMaxNumericSize)
  {
    char* buf = buffer_.current();
    buf[0] = '0';
    buf[1] = 'x';
    size_t len = convertHex(buf+2, v);
    buffer_.add(len+2);
  }
  return *this;
}